

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

UMutableCPTrie * umutablecptrie_fromUCPTrie_63(UCPTrie *trie,UErrorCode *pErrorCode)

{
  char cVar1;
  uint end;
  MutableCodePointTrie *this;
  uint iniValue;
  UErrorCode *p_00;
  uint32_t errValue;
  uint start;
  MutableCodePointTrie *p;
  MutableCodePointTrie *pMVar2;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  MutableCodePointTrie *local_40;
  uint32_t local_34;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  if (trie == (UCPTrie *)0x0) {
LAB_002d7db1:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMutableCPTrie *)0x0;
  }
  cVar1 = trie->valueWidth;
  if (cVar1 == '\x02') {
    errValue = (uint32_t)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -1);
    iniValue = (uint)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -2);
  }
  else if (cVar1 == '\x01') {
    iniValue = *(uint *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -8);
    errValue = *(uint32_t *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -4);
  }
  else {
    if (cVar1 != '\0') goto LAB_002d7db1;
    errValue = (uint32_t)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -2);
    iniValue = (uint)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -4);
  }
  p_00 = pErrorCode;
  this = (MutableCodePointTrie *)
         icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
  if (this == (MutableCodePointTrie *)0x0) {
    this = (MutableCodePointTrie *)0x0;
  }
  else {
    p_00 = (UErrorCode *)(ulong)iniValue;
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this,iniValue,errValue,pErrorCode);
  }
  if ((this == (MutableCodePointTrie *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  start = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    while( true ) {
      p_00 = (UErrorCode *)(ulong)start;
      end = ucptrie_getRange_63(trie,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                (void *)0x0,&local_34);
      if ((int)end < 0) break;
      if (local_34 != iniValue) {
        if (start == end) {
          icu_63::anon_unknown_0::MutableCodePointTrie::set(this,start,local_34,pErrorCode);
        }
        else {
          icu_63::anon_unknown_0::MutableCodePointTrie::setRange(this,start,end,local_34,pErrorCode)
          ;
        }
      }
      start = end + 1;
    }
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      local_40 = (MutableCodePointTrie *)0x0;
      pMVar2 = this;
      goto LAB_002d7e9b;
    }
  }
  pMVar2 = (MutableCodePointTrie *)0x0;
  local_40 = this;
LAB_002d7e9b:
  if (local_40 != (MutableCodePointTrie *)0x0) {
    icu_63::anon_unknown_0::MutableCodePointTrie::~MutableCodePointTrie(local_40);
    icu_63::UMemory::operator_delete((UMemory *)local_40,p_00);
    return (UMutableCPTrie *)pMVar2;
  }
  return (UMutableCPTrie *)pMVar2;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}